

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alternate_shared_mutex.hpp
# Opt level: O0

void __thiscall
yamc::alternate::detail::shared_mutex_base<yamc::rwlock::WriterPrefer>::lock_shared
          (shared_mutex_base<yamc::rwlock::WriterPrefer> *this)

{
  bool bVar1;
  undefined1 local_20 [8];
  unique_lock<std::mutex> lk;
  shared_mutex_base<yamc::rwlock::WriterPrefer> *this_local;
  
  lk._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_20,&this->mtx_);
  while( true ) {
    bVar1 = rwlock::WriterPrefer::wait_rlock(&this->state_);
    if (!bVar1) break;
    std::condition_variable::wait((unique_lock *)&this->cv_);
  }
  rwlock::WriterPrefer::acquire_rlock(&this->state_);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_20);
  return;
}

Assistant:

void lock_shared()
  {
    std::unique_lock<decltype(mtx_)> lk(mtx_);
    while (RwLockPolicy::wait_rlock(state_)) {
      cv_.wait(lk);
    }
    RwLockPolicy::acquire_rlock(state_);
  }